

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O1

IDenseNetwork * __thiscall IDenseNetwork::ResetStats(IDenseNetwork *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  ppIVar1 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    (*(*ppIVar2)->_vptr_ILayer[5])();
  }
  return this;
}

Assistant:

IDenseNetwork &IDenseNetwork::ResetStats()
{
    for ( auto layer: layers ) {
        layer->ResetStats();
    }
    return *this;
}